

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  int ret;
  int is_nonce_valid;
  uint local_e4;
  secp256k1_scalar *local_e0;
  secp256k1_scalar *local_d8;
  int *local_d0;
  uchar *local_c8;
  uchar *local_c0;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  uchar nonce32 [32];
  secp256k1_scalar non;
  
  ret = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar3 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar3 = noncefp;
  }
  local_e0 = r;
  local_d8 = s;
  local_d0 = recid;
  local_c8 = msg32;
  local_c0 = seckey;
  local_e4 = secp256k1_scalar_set_b32_seckey(&sec,seckey);
  secp256k1_scalar_cmov(&sec,&secp256k1_scalar_one,local_e4 ^ 1);
  secp256k1_scalar_set_b32(&msg,local_c8,(int *)0x0);
  uVar2 = 0;
  while( true ) {
    iVar1 = (*pcVar3)(nonce32,local_c8,local_c0,(uchar *)0x0,noncedata,uVar2);
    ret = (int)(iVar1 != 0);
    if (iVar1 == 0) break;
    is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non,nonce32);
    secp256k1_declassify(ctx,&is_nonce_valid,4);
    if (is_nonce_valid != 0) {
      ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx,local_e0,local_d8,&sec,&msg,&non,local_d0)
      ;
      secp256k1_declassify(ctx,&ret,4);
      if (ret != 0) goto LAB_001029e7;
    }
    uVar2 = uVar2 + 1;
  }
  ret = 0;
LAB_001029e7:
  ret = ret & local_e4;
  secp256k1_memclear(nonce32,0x20);
  secp256k1_scalar_clear(&msg);
  secp256k1_scalar_clear(&non);
  secp256k1_scalar_clear(&sec);
  secp256k1_scalar_cmov(local_e0,&secp256k1_scalar_zero,(uint)(ret == 0));
  secp256k1_scalar_cmov(local_d8,&secp256k1_scalar_zero,(uint)(ret == 0));
  if (local_d0 != (int *)0x0) {
    is_nonce_valid = 0;
    secp256k1_int_cmov(local_d0,&is_nonce_valid,(uint)(ret == 0));
  }
  return ret;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}